

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O3

int __thiscall OpenMD::OpenMDBitSet::nthOnBit(OpenMDBitSet *this,unsigned_long n)

{
  int iVar1;
  int i;
  vector<int,_std::allocator<int>_> indices;
  int local_3c;
  void *local_38;
  iterator iStack_30;
  int *local_28;
  
  local_38 = (void *)0x0;
  iStack_30._M_current = (int *)0x0;
  local_28 = (int *)0x0;
  local_3c = firstOnBit(this);
  if (local_3c == -1) {
    iVar1 = -1;
  }
  else {
    do {
      if (iStack_30._M_current == local_28) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_38,iStack_30,&local_3c);
      }
      else {
        *iStack_30._M_current = local_3c;
        iStack_30._M_current = iStack_30._M_current + 1;
      }
      local_3c = nextOnBit(this,local_3c);
    } while (local_3c != -1);
    if (n < (ulong)((long)iStack_30._M_current - (long)local_38 >> 2)) {
      iVar1 = *(int *)((long)local_38 + n * 4);
    }
    else {
      iVar1 = -1;
      if (local_38 == (void *)0x0) {
        return -1;
      }
    }
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return iVar1;
}

Assistant:

int OpenMDBitSet::nthOnBit(unsigned long int n) const {
    std::vector<int> indices;
    for (int i = firstOnBit(); i != -1; i = nextOnBit(i)) {
      indices.push_back(i);
    }

    if (n < indices.size()) return indices[n];
    return -1;
  }